

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O2

int run_test_fork_threadpool_queue_work_simple(void)

{
  __pid_t child_pid;
  uint uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  uv_loop_t loop;
  uv_loop_t uStack_358;
  
  puVar3 = uv_default_loop();
  assert_run_work(puVar3);
  child_pid = fork();
  if (child_pid == 0) {
    uVar1 = getpid();
    printf("Running child in %d\n",(ulong)uVar1);
    uv_loop_init(&uStack_358);
    puts("Child first watch");
    assert_run_work(&uStack_358);
    uv_loop_close(&uStack_358);
    puts("Child second watch default loop");
    puVar3 = uv_default_loop();
    iVar2 = uv_loop_fork(puVar3);
    if (iVar2 != 0) {
      pcVar5 = "0 == uv_loop_fork(uv_default_loop())";
      uVar4 = 0x29c;
      goto LAB_00116c5d;
    }
    puVar3 = uv_default_loop();
    assert_run_work(puVar3);
    puts("Exiting child ");
  }
  else {
    if (child_pid == -1) {
      pcVar5 = "child_pid != -1";
      uVar4 = 0x28d;
      goto LAB_00116c5d;
    }
    puVar3 = uv_default_loop();
    assert_run_work(puVar3);
    assert_wait_child(child_pid);
  }
  puVar3 = uv_default_loop();
  close_loop(puVar3);
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_close(puVar3);
  if (iVar2 == 0) {
    return 0;
  }
  pcVar5 = "0 == uv_loop_close(uv_default_loop())";
  uVar4 = 0x2a2;
LAB_00116c5d:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fork.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(fork_threadpool_queue_work_simple) {
  /* The threadpool works in a child process. */

  pid_t child_pid;
  uv_loop_t loop;

  /* Prime the pool and default loop. */
  assert_run_work(uv_default_loop());

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* Parent. We can still run work. */
    assert_run_work(uv_default_loop());
    assert_wait_child(child_pid);
  } else {
    /* Child. We can work in a new loop. */
    printf("Running child in %d\n", getpid());
    uv_loop_init(&loop);
    printf("Child first watch\n");
    assert_run_work(&loop);
    uv_loop_close(&loop);
    printf("Child second watch default loop\n");
    /* We can work in the default loop. */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    assert_run_work(uv_default_loop());
    printf("Exiting child \n");
  }


  MAKE_VALGRIND_HAPPY();
  return 0;
}